

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O1

void __thiscall
ot::commissioner::JobManager::WarningMsg(JobManager *this,uint64_t aNid,string *aMessage)

{
  Interpreter *this_00;
  pointer pcVar1;
  string local_40;
  
  this_00 = this->mInterpreter;
  pcVar1 = (aMessage->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + aMessage->_M_string_length);
  Interpreter::PrintNetworkMessage(this_00,aNid,&local_40,kMagenta);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void JobManager::WarningMsg(uint64_t aNid, std::string aMessage)
{
    mInterpreter.PrintNetworkMessage(aNid, aMessage, Console::Color::kMagenta);
}